

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O0

bool __thiscall Js::JavascriptPromise::WillRejectionBeUnhandled(JavascriptPromise *this)

{
  code *pcVar1;
  JavascriptPromiseReaction *this_00;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  JavascriptPromise *this_01;
  JavascriptPromiseReactionList *this_02;
  undefined4 *puVar5;
  SListNodeBase<Memory::Recycler> **ppSVar6;
  Type *pTVar7;
  JavascriptPromiseCapability *this_03;
  RecyclableObject *obj;
  JavascriptFunction *pJVar8;
  FunctionInfo *pFVar9;
  ScriptContext *this_04;
  JavascriptLibrary *this_05;
  FunctionInfo *pFVar10;
  Iterator IVar11;
  byte local_129;
  FunctionInfo *functionInfo;
  JavascriptFunction *func;
  RecyclableObject *handler;
  JavascriptPromise *p;
  Var promiseVar;
  JavascriptPromiseReaction *reaction;
  JavascriptPromiseReactionPair pair;
  Iterator it;
  JavascriptPromiseReactionList *reactions;
  JavascriptPromise *curr;
  undefined1 local_a0 [8];
  SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
  visited;
  Stack<Js::JavascriptPromise_*,_Memory::HeapAllocator,_false,_DefaultComparer> stack;
  bool willBeUnhandled;
  JavascriptPromise *this_local;
  SListNodeBase<Memory::Recycler> local_20;
  JavascriptPromiseReaction **local_18;
  bool local_9;
  
  bVar2 = GetIsHandled(this);
  stack.list._47_1_ = (bVar2 ^ 0xffU) & 1;
  if (stack.list._47_1_ == 0) {
    JsUtil::Stack<Js::JavascriptPromise_*,_Memory::HeapAllocator,_false,_DefaultComparer>::Stack
              ((Stack<Js::JavascriptPromise_*,_Memory::HeapAllocator,_false,_DefaultComparer> *)
               &visited.stats,&Memory::HeapAllocator::Instance);
    SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
    ::SimpleHashTable((SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
                       *)local_a0,&Memory::HeapAllocator::Instance);
    curr = this;
    JsUtil::Stack<Js::JavascriptPromise_*,_Memory::HeapAllocator,_false,_DefaultComparer>::Push
              ((Stack<Js::JavascriptPromise_*,_Memory::HeapAllocator,_false,_DefaultComparer> *)
               &visited.stats,&curr);
    SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
    ::Add((SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
           *)local_a0,this,1);
LAB_012ea158:
    local_129 = 0;
    if (stack.list._47_1_ == '\0') {
      bVar2 = JsUtil::Stack<Js::JavascriptPromise_*,_Memory::HeapAllocator,_false,_DefaultComparer>
              ::Empty((Stack<Js::JavascriptPromise_*,_Memory::HeapAllocator,_false,_DefaultComparer>
                       *)&visited.stats);
      local_129 = bVar2 ^ 0xff;
    }
    if ((local_129 & 1) != 0) {
      this_01 = JsUtil::
                Stack<Js::JavascriptPromise_*,_Memory::HeapAllocator,_false,_DefaultComparer>::Pop
                          ((Stack<Js::JavascriptPromise_*,_Memory::HeapAllocator,_false,_DefaultComparer>
                            *)&visited.stats);
      this_02 = GetReactions(this_01);
      IVar11 = SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::
               GetIterator(&this_02->
                            super_SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>
                          );
      do {
        it.list = (SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
                  IVar11.current;
        pair.rejectReaction = (JavascriptPromiseReaction *)IVar11.list;
        local_18 = &pair.rejectReaction;
        if (it.list ==
            (SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                      ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          IVar11.current = (NodeBase *)0x0;
          IVar11.list = (SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *
                        )pair.rejectReaction;
          *puVar5 = 0;
        }
        pair.rejectReaction = (JavascriptPromiseReaction *)IVar11.list;
        this_00 = pair.rejectReaction;
        SListNodeBase<Memory::Recycler>::Next(&local_20);
        ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SListNodeBase__
                            ((WriteBarrierPtr *)&local_20);
        bVar2 = SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::IsHead
                          ((SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>
                            *)this_00,*ppSVar6);
        if (bVar2) {
          it.list = (SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)0x0
          ;
        }
        else {
          SListNodeBase<Memory::Recycler>::Next((SListNodeBase<Memory::Recycler> *)&this_local);
          ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SListNodeBase__
                              ((WriteBarrierPtr *)&this_local);
          it.list = (SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
                    *ppSVar6;
        }
        local_9 = !bVar2;
        if (!local_9) goto LAB_012ea158;
        pTVar7 = SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::Iterator
                 ::Data((Iterator *)&pair.rejectReaction);
        reaction = pTVar7->resolveReaction;
        promiseVar = pTVar7->rejectReaction;
        pair.resolveReaction = (JavascriptPromiseReaction *)promiseVar;
        this_03 = JavascriptPromiseReaction::GetCapabilities
                            ((JavascriptPromiseReaction *)promiseVar);
        p = (JavascriptPromise *)JavascriptPromiseCapability::GetPromise(this_03);
        bVar2 = VarIs<Js::JavascriptPromise>(p);
        if (bVar2) {
          handler = (RecyclableObject *)VarTo<Js::JavascriptPromise>(p);
          bVar2 = GetIsHandled((JavascriptPromise *)handler);
          if (!bVar2) {
            obj = JavascriptPromiseReaction::GetHandler((JavascriptPromiseReaction *)promiseVar);
            bVar2 = VarIs<Js::JavascriptFunction,Js::RecyclableObject>(obj);
            if (bVar2) {
              pJVar8 = VarTo<Js::JavascriptFunction,Js::RecyclableObject>(obj);
              pFVar9 = JavascriptFunction::GetFunctionInfo(pJVar8);
              iVar3 = (*(pJVar8->super_DynamicObject).super_RecyclableObject.super_FinalizableObject
                        .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x66])();
              if (iVar3 == 0) {
                this_04 = RecyclableObject::GetScriptContext((RecyclableObject *)pJVar8);
                this_05 = ScriptContext::GetLibrary(this_04);
                pJVar8 = JavascriptLibrary::GetThrowerFunction(this_05);
                pFVar10 = JavascriptFunction::GetFunctionInfo(pJVar8);
                if (pFVar10 != (FunctionInfo *)EntryInfo::Thrower) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar5 = 1;
                  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                              ,0x541,
                                              "(func->GetScriptContext()->GetLibrary()->GetThrowerFunction()->GetFunctionInfo() == &JavascriptPromise::EntryInfo::Thrower)"
                                              ,"unexpected FunctionInfo for thrower function!");
                  if (!bVar2) {
                    pcVar1 = (code *)invalidInstructionException();
                    (*pcVar1)();
                  }
                  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar5 = 0;
                }
              }
              if (pFVar9 == (FunctionInfo *)EntryInfo::Thrower) {
                stack.list._47_1_ = 1;
                goto LAB_012ea158;
              }
            }
          }
          BVar4 = SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
                  ::HasEntry((SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
                              *)local_a0,(JavascriptPromise *)handler);
          if (BVar4 != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                        ,0x54e,"(visited.HasEntry(p) == false)",
                                        "Unexpected cycle in promise reaction tree!");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 0;
          }
          BVar4 = SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
                  ::HasEntry((SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
                              *)local_a0,(JavascriptPromise *)handler);
          if (BVar4 == 0) {
            JsUtil::Stack<Js::JavascriptPromise_*,_Memory::HeapAllocator,_false,_DefaultComparer>::
            Push((Stack<Js::JavascriptPromise_*,_Memory::HeapAllocator,_false,_DefaultComparer> *)
                 &visited.stats,(JavascriptPromise **)&handler);
            SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
            ::Add((SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
                   *)local_a0,(JavascriptPromise *)handler,1);
          }
        }
        IVar11.current = &(it.list)->super_SListNodeBase<Memory::Recycler>;
        IVar11.list = (SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
                      pair.rejectReaction;
      } while( true );
    }
    SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
    ::~SimpleHashTable((SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
                        *)local_a0);
    JsUtil::Stack<Js::JavascriptPromise_*,_Memory::HeapAllocator,_false,_DefaultComparer>::~Stack
              ((Stack<Js::JavascriptPromise_*,_Memory::HeapAllocator,_false,_DefaultComparer> *)
               &visited.stats);
  }
  return (bool)stack.list._47_1_;
}

Assistant:

bool JavascriptPromise::WillRejectionBeUnhandled()
    {
        bool willBeUnhandled = !this->GetIsHandled();
        if (!willBeUnhandled)
        {
            // if this promise is handled, then we need to do a depth-first search over this promise's reject
            // reactions. If we find a reaction that
            //    - associated promise is "unhandled" (ie, it's never been "then'd")
            //    - AND its rejection handler is our default "thrower function"
            // then this promise results in an unhandled rejection path.

            JsUtil::Stack<JavascriptPromise*, HeapAllocator> stack(&HeapAllocator::Instance);
            SimpleHashTable<JavascriptPromise*, int, HeapAllocator> visited(&HeapAllocator::Instance);
            stack.Push(this);
            visited.Add(this, 1);

            while (!willBeUnhandled && !stack.Empty())
            {
                JavascriptPromise * curr = stack.Pop();
                {
                    JavascriptPromiseReactionList* reactions = curr->GetReactions();
                    JavascriptPromiseReactionList::Iterator it = reactions->GetIterator();
                    while (it.Next())
                    {
                        JavascriptPromiseReactionPair pair = it.Data();
                        JavascriptPromiseReaction* reaction = pair.rejectReaction;
                        Var promiseVar = reaction->GetCapabilities()->GetPromise();

                        if (VarIs<JavascriptPromise>(promiseVar))
                        {
                            JavascriptPromise* p = VarTo<JavascriptPromise>(promiseVar);
                            if (!p->GetIsHandled())
                            {
                                RecyclableObject* handler = reaction->GetHandler();
                                if (VarIs<JavascriptFunction>(handler))
                                {
                                    JavascriptFunction* func = VarTo<JavascriptFunction>(handler);
                                    FunctionInfo* functionInfo = func->GetFunctionInfo();

#ifdef DEBUG
                                    if (!func->IsCrossSiteObject())
                                    {
                                        // assert that Thrower function's FunctionInfo hasn't changed
                                        AssertMsg(func->GetScriptContext()->GetLibrary()->GetThrowerFunction()->GetFunctionInfo() == &JavascriptPromise::EntryInfo::Thrower, "unexpected FunctionInfo for thrower function!");
                                    }
#endif

                                    // If the function info is the default thrower function's function info, then assume that this is unhandled
                                    // this will work across script contexts
                                    if (functionInfo == &JavascriptPromise::EntryInfo::Thrower)
                                    {
                                        willBeUnhandled = true;
                                        break;
                                    }
                                }
                            }
                            AssertMsg(visited.HasEntry(p) == false, "Unexpected cycle in promise reaction tree!");
                            if (!visited.HasEntry(p))
                            {
                                stack.Push(p);
                                visited.Add(p, 1);
                            }
                        }
                    }
                }
            }
        }
        return willBeUnhandled;
    }